

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::continueCidr(Lexer *this,size_t range)

{
  Report *pRVar1;
  int iVar2;
  uint uVar3;
  SourceLocation *pSVar4;
  size_t sVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  size_t local_20;
  size_t range_local;
  Lexer *this_local;
  
  local_20 = range;
  range_local = (size_t)this;
  nextChar(this,true);
  iVar2 = currentChar(this);
  iVar2 = isdigit(iVar2);
  if (iVar2 == 0) {
    pRVar1 = this->report_;
    pSVar4 = lastLocation(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"{}[{}:{}]: invalid byte {}",&local_41);
    std::__cxx11::string::string((string *)&local_78,(string *)&this->location_);
    sVar5 = line(this);
    sVar6 = column(this);
    uVar3 = currentChar(this);
    diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long,int>
              (pRVar1,pSVar4,&local_40,&local_78,sVar5,sVar6,uVar3 & 0xff);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this->token_ = Unknown;
    this_local._4_4_ = Unknown;
  }
  else {
    this->numberValue_ = 0;
    while( true ) {
      iVar2 = currentChar(this);
      iVar2 = isdigit(iVar2);
      if (iVar2 == 0) break;
      this->numberValue_ = this->numberValue_ * 10;
      iVar2 = currentChar(this);
      this->numberValue_ = (long)(iVar2 + -0x30) + this->numberValue_;
      iVar2 = currentChar(this);
      std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
      nextChar(this,true);
    }
    if ((long)local_20 < this->numberValue_) {
      pRVar1 = this->report_;
      pSVar4 = lastLocation(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"{}[{}:{}]: CIDR prefix out of range.",&local_99);
      std::__cxx11::string::string((string *)&local_c0,(string *)&this->location_);
      sVar5 = line(this);
      sVar6 = column(this);
      diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long>
                (pRVar1,pSVar4,&local_98,&local_c0,sVar5,sVar6);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      this->token_ = Unknown;
      this_local._4_4_ = Unknown;
    }
    else {
      this->token_ = Cidr;
      this_local._4_4_ = Cidr;
    }
  }
  return this_local._4_4_;
}

Assistant:

Token Lexer::continueCidr(size_t range) {
  // IPv6 CIDR
  nextChar();  // consume '/'

  if (!std::isdigit(currentChar())) {
    report_.tokenError(lastLocation(),
        "{}[{}:{}]: invalid byte {}",
        location_.filename,
        line(),
        column(),
        (int)(currentChar() & 0xFF));
    return token_ = Token::Unknown;
  }

  numberValue_ = 0;
  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  if (numberValue_ > static_cast<decltype(numberValue_)>(range)) {
    report_.tokenError(lastLocation(),
                       "{}[{}:{}]: CIDR prefix out of range.",
                       location_.filename, line(), column());
    return token_ = Token::Unknown;
  }

  return token_ = Token::Cidr;
}